

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool parser::operator==(Convolution *lhs,Convolution *rhs)

{
  bool bVar1;
  pointer pGVar2;
  pointer pGVar3;
  pointer pGVar4;
  pointer pGVar5;
  bool *pbVar6;
  
  if (lhs->header == rhs->header) {
    pGVar2 = (lhs->body).
             super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pGVar3 = (lhs->body).
             super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pGVar5 = (rhs->body).
             super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)pGVar3 - (long)pGVar2 ==
        (long)(rhs->body).
              super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)pGVar5) {
      if (pGVar2 == pGVar3) {
        return pGVar2 == pGVar3;
      }
      if (pGVar2->value != pGVar5->value) {
        return false;
      }
      if (pGVar2->isTerminal != pGVar5->isTerminal) {
        return false;
      }
      pbVar6 = &pGVar5[1].isTerminal;
      while( true ) {
        pGVar5 = pGVar2 + 1;
        if (pGVar5 == pGVar3) {
          return pGVar5 == pGVar3;
        }
        if (pGVar5->value != ((GrammaticSymbol *)(pbVar6 + -4))->value) break;
        bVar1 = *pbVar6;
        pbVar6 = pbVar6 + 8;
        pGVar4 = pGVar2 + 1;
        pGVar2 = pGVar5;
        if (pGVar4->isTerminal != bVar1) {
          return false;
        }
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool operator==(const Convolution& lhs, const Convolution& rhs) {
            return lhs.header == rhs.header &&
                   lhs.body == rhs.body;
        }